

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcContain.c
# Opt level: O2

int Mvc_CoverContain(Mvc_Cover_t *pCover)

{
  int *piVar1;
  int _i_;
  int iVar2;
  uint uVar3;
  int iVar4;
  Mvc_Cube_t *pMVar5;
  Mvc_Cube_t *pMVar6;
  Mvc_Cube_t *pMVar7;
  ulong uVar8;
  Mvc_Cube_t *pMVar10;
  Mvc_Cube_t *pMVar11;
  Mvc_Cube_t *pMVar12;
  Mvc_Cube_t *pMVar13;
  ulong uVar9;
  
  iVar2 = Mvc_CoverReadCubeNum(pCover);
  uVar3 = 0;
  if (1 < iVar2) {
    Mvc_CoverSetCubeSizes(pCover);
    Mvc_CoverSort(pCover,(Mvc_Cube_t *)0x0,Mvc_CubeCompareSizeAndInt);
    pMVar5 = Mvc_CoverReadCubeHead(pCover);
    pMVar6 = pMVar5->pNext;
    pMVar11 = (Mvc_Cube_t *)0x0;
    if (pMVar6 != (Mvc_Cube_t *)0x0) {
      pMVar11 = pMVar6->pNext;
    }
    while (pMVar12 = pMVar11, pMVar6 != (Mvc_Cube_t *)0x0) {
      uVar3 = *(uint *)&pMVar5->field_0x8 & 0xffffff;
      pMVar10 = pMVar6;
      if (uVar3 == 0) {
        if (pMVar5->pData[0] == pMVar6->pData[0]) {
LAB_0037d261:
          pMVar11 = pMVar6->pNext;
          pMVar5->pNext = pMVar11;
          if ((pCover->lCubes).pTail == pMVar6) {
            if (pMVar11 != (Mvc_Cube_t *)0x0) {
              __assert_fail("pCube->pNext == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcContain.c"
                            ,0x56,"void Mvc_CoverRemoveDuplicates(Mvc_Cover_t *)");
            }
            (pCover->lCubes).pTail = pMVar5;
          }
          piVar1 = &(pCover->lCubes).nItems;
          *piVar1 = *piVar1 + -1;
          Mvc_CubeFree(pCover,pMVar6);
          pMVar10 = pMVar5;
        }
      }
      else if (uVar3 == 1) {
        if ((pMVar5->pData[0] == pMVar6->pData[0]) &&
           (*(int *)&pMVar5->field_0x14 == *(int *)&pMVar6->field_0x14)) goto LAB_0037d261;
      }
      else {
        do {
          if ((int)uVar3 < 0) goto LAB_0037d261;
          uVar8 = (ulong)uVar3;
          uVar9 = (ulong)uVar3;
          uVar3 = uVar3 - 1;
        } while (pMVar5->pData[uVar8] == pMVar6->pData[uVar9]);
      }
      pMVar6 = pMVar12;
      pMVar11 = (Mvc_Cube_t *)0x0;
      pMVar5 = pMVar10;
      if (pMVar12 != (Mvc_Cube_t *)0x0) {
        pMVar11 = pMVar12->pNext;
      }
    }
    pMVar6 = Mvc_CoverReadCubeHead(pCover);
    do {
      pMVar11 = pMVar6;
      do {
        pMVar5 = pMVar11;
        pMVar11 = pMVar5->pNext;
        if (pMVar11 == (Mvc_Cube_t *)0x0) goto LAB_0037d3bb;
      } while (pMVar6->nOnes == pMVar11->nOnes);
      for (; pMVar6 != (Mvc_Cube_t *)0x0; pMVar6 = pMVar6->pNext) {
        pMVar12 = pMVar5;
        if (pMVar11 == (Mvc_Cube_t *)0x0) {
          pMVar10 = (Mvc_Cube_t *)0x0;
        }
        else {
          pMVar10 = pMVar11->pNext;
        }
        while (pMVar7 = pMVar10, pMVar11 != (Mvc_Cube_t *)0x0) {
          uVar3 = *(uint *)&pMVar11->field_0x8 & 0xffffff;
          pMVar13 = pMVar11;
          if (uVar3 == 0) {
            uVar3 = ~pMVar6->pData[0] & pMVar11->pData[0];
LAB_0037d351:
            if (uVar3 == 0) {
LAB_0037d35a:
              pMVar10 = pMVar12;
              if (pMVar12 == (Mvc_Cube_t *)0x0) {
                pMVar10 = (Mvc_Cube_t *)&pCover->lCubes;
              }
              pMVar13 = pMVar11->pNext;
              pMVar10->pNext = pMVar13;
              if ((pCover->lCubes).pTail == pMVar11) {
                if (pMVar13 != (Mvc_Cube_t *)0x0) {
                  __assert_fail("pCube->pNext == NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcContain.c"
                                ,0x97,"void Mvc_CoverRemoveContained(Mvc_Cover_t *)");
                }
                (pCover->lCubes).pTail = pMVar12;
              }
              piVar1 = &(pCover->lCubes).nItems;
              *piVar1 = *piVar1 + -1;
              Mvc_CubeFree(pCover,pMVar11);
              pMVar13 = pMVar12;
            }
          }
          else if (uVar3 == 1) {
            if ((pMVar11->pData[0] & ~pMVar6->pData[0]) == 0) {
              uVar3 = (uint)((*(uint *)&pMVar11->field_0x14 & ~*(uint *)&pMVar6->field_0x14) != 0);
              goto LAB_0037d351;
            }
          }
          else {
            do {
              if ((int)uVar3 < 0) goto LAB_0037d35a;
              uVar8 = (ulong)uVar3;
              uVar9 = (ulong)uVar3;
              uVar3 = uVar3 - 1;
            } while ((pMVar11->pData[uVar9] & ~pMVar6->pData[uVar8]) == 0);
          }
          pMVar10 = (Mvc_Cube_t *)0x0;
          pMVar11 = pMVar7;
          pMVar12 = pMVar13;
          if (pMVar7 != (Mvc_Cube_t *)0x0) {
            pMVar10 = pMVar7->pNext;
          }
        }
        if (pMVar6 == pMVar5) {
          pMVar11 = pMVar5->pNext;
          break;
        }
        pMVar11 = pMVar5->pNext;
      }
      pMVar6 = pMVar11;
    } while (pMVar11 != (Mvc_Cube_t *)0x0);
LAB_0037d3bb:
    iVar4 = Mvc_CoverReadCubeNum(pCover);
    uVar3 = (uint)(iVar2 != iVar4);
  }
  return uVar3;
}

Assistant:

int  Mvc_CoverContain( Mvc_Cover_t * pCover )
{
    int nCubes;
    nCubes = Mvc_CoverReadCubeNum( pCover );
    if ( nCubes < 2 )
        return 0;
    Mvc_CoverSetCubeSizes(pCover);
    Mvc_CoverSort( pCover, NULL, Mvc_CubeCompareSizeAndInt );
    Mvc_CoverRemoveDuplicates( pCover );
    if ( nCubes > 1 )
        Mvc_CoverRemoveContained( pCover );
    return (nCubes != Mvc_CoverReadCubeNum(pCover));
}